

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O0

void eltcalc::doeltoutput
               (int samplesize,bool skipHeader,bool ordOutput,FILE **fout,
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *parquetFileNames)

{
  OASIS_FLOAT OVar1;
  size_type sVar2;
  reference pvVar3;
  double dVar4;
  int local_dc;
  float *local_d8;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_d0;
  float *local_c8;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_c0;
  int local_b4;
  duration<long,_std::ratio<1L,_1000L>_> local_b0;
  float local_a8;
  int local_a4;
  OASIS_FLOAT x;
  sampleslevelRec sr;
  OASIS_FLOAT max_loss;
  int non_zero_samples;
  OASIS_FLOAT chance_of_loss;
  OASIS_FLOAT max_impacted_exposure;
  OASIS_FLOAT mean_impacted_exposure;
  size_t i;
  summarySampleslevelHeader sh;
  value_type_conflict local_64;
  undefined1 local_60 [8];
  vector<float,_std::allocator<float>_> losses_vec;
  FILE *outFile;
  _func_void_summarySampleslevelHeader_ptr_int_OASIS_FLOAT_OASIS_FLOAT_FILE_ptr_OASIS_FLOAT_OASIS_FLOAT_OASIS_FLOAT_OASIS_FLOAT
  *OutputData;
  float local_30;
  OASIS_FLOAT sumlosssqr;
  OASIS_FLOAT sd;
  OASIS_FLOAT analytical_mean;
  OASIS_FLOAT sample_mean;
  OASIS_FLOAT sumloss;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *parquetFileNames_local;
  FILE **fout_local;
  bool ordOutput_local;
  bool skipHeader_local;
  int samplesize_local;
  
  sd = 0.0;
  outFile = (FILE *)0x0;
  losses_vec.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (ordOutput) {
    if (!skipHeader) {
      if (*fout != (FILE *)0x0) {
        fprintf((FILE *)*fout,
                "EventId,SummaryId,SampleType,EventRate,ChanceOfLoss,MeanLoss,SDLoss,MaxLoss,FootprintExposure,MeanImpactedExposure,MaxImpactedExposure\n"
               );
      }
      if (fout[1] != (FILE *)0x0) {
        fprintf((FILE *)fout[1],"EventId,SummaryId,Quantile,Loss\n");
      }
    }
    outFile = (FILE *)OutputRowsORD;
    losses_vec.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*fout;
  }
  else {
    sVar2 = std::
            map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size(parquetFileNames);
    if (sVar2 == 0) {
      if (!skipHeader) {
        printf("summary_id,type,event_id,mean,standard_deviation,exposure_value\n");
      }
      outFile = (FILE *)OutputRows;
      losses_vec.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = _stdout;
    }
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_60);
  if (fout[1] != (FILE *)0x0) {
    local_64 = 0.0;
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)local_60,(long)samplesize,&local_64);
  }
  _max_impacted_exposure = fread(&i,0xc,1,_stdin);
  while( true ) {
    analytical_mean = 0.0;
    sumlosssqr = 0.0;
    OutputData._4_4_ = 0.0;
    if (_max_impacted_exposure == 0) break;
    chance_of_loss = 0.0;
    non_zero_samples = 0;
    max_loss = 0.0;
    sr.loss = 0.0;
    sr.sidx = 0;
    _max_impacted_exposure = fread(&local_a4,8,1,_stdin);
    while (OVar1 = x, _max_impacted_exposure != 0 && local_a4 != 0) {
      if (local_a4 < 1) {
        if (local_a4 == -1) {
          sumlosssqr = x;
        }
        else if (local_a4 == -5) {
          sr.sidx = (int)x;
        }
      }
      else {
        analytical_mean = x + analytical_mean;
        OutputData._4_4_ = x * x + OutputData._4_4_;
        if (fout[1] != (FILE *)0x0) {
          pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)local_60,
                              (long)(local_a4 + -1));
          *pvVar3 = OVar1;
        }
        if (0.0 < x) {
          chance_of_loss = (float)sh.event_id + chance_of_loss;
          if ((float)non_zero_samples < (float)sh.event_id) {
            non_zero_samples = sh.event_id;
          }
          sr.loss = (OASIS_FLOAT)((int)sr.loss + 1);
        }
      }
      _max_impacted_exposure = fread(&local_a4,8,1,_stdin);
    }
    if (samplesize < 2) {
      if (samplesize == 0) {
        sd = 0.0;
      }
      if (samplesize == 1) {
        sd = analytical_mean / 1.0;
      }
      local_30 = 0.0;
    }
    else {
      sd = analytical_mean / (float)samplesize;
      local_30 = (OutputData._4_4_ - (analytical_mean * analytical_mean) / (float)samplesize) /
                 (float)(samplesize + -1);
      local_a8 = local_30 / OutputData._4_4_;
      if (local_a8 < 1e-07) {
        local_30 = 0.0;
      }
      dVar4 = std::sqrt((double)(ulong)(uint)local_30);
      local_30 = SUB84(dVar4,0);
      chance_of_loss = chance_of_loss / (float)samplesize;
      max_loss = (float)(int)sr.loss / (float)samplesize;
    }
    if (0.0 < (float)sh.event_id) {
      if (outFile != (FILE *)0x0) {
        (*(code *)outFile)(sumlosssqr,0,sh.event_id,sh.event_id,0,sr.sidx,&i,1,
                           losses_vec.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      }
      if ((firstOutput & 1) == 1) {
        local_b4 = 1000;
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1000l>> *)&local_b0,&local_b4);
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_b0);
        firstOutput = 0;
      }
      if (samplesize != 0) {
        if (outFile != (FILE *)0x0) {
          (*(code *)outFile)(sd,local_30,chance_of_loss,non_zero_samples,max_loss,sr.sidx,&i,2,
                             losses_vec.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
        }
        if (fout[1] != (FILE *)0x0) {
          local_c0._M_current =
               (float *)std::vector<float,_std::allocator<float>_>::begin
                                  ((vector<float,_std::allocator<float>_> *)local_60);
          local_c8 = (float *)std::vector<float,_std::allocator<float>_>::end
                                        ((vector<float,_std::allocator<float>_> *)local_60);
          std::sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                    (local_c0,(__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                               )local_c8);
          OutputQuantiles((summarySampleslevelHeader *)&i,
                          (vector<float,_std::allocator<float>_> *)local_60,fout[1]);
          local_d0._M_current =
               (float *)std::vector<float,_std::allocator<float>_>::begin
                                  ((vector<float,_std::allocator<float>_> *)local_60);
          local_d8 = (float *)std::vector<float,_std::allocator<float>_>::end
                                        ((vector<float,_std::allocator<float>_> *)local_60);
          local_dc = 0;
          std::
          fill<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,int>
                    (local_d0,(__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                               )local_d8,&local_dc);
        }
      }
    }
    if (_max_impacted_exposure != 0) {
      _max_impacted_exposure = fread(&i,0xc,1,_stdin);
    }
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_60);
  return;
}

Assistant:

void doeltoutput(int samplesize, bool skipHeader, bool ordOutput,
			 FILE **fout,
			 std::map<int, std::string> &parquetFileNames)
	{
		OASIS_FLOAT sumloss = 0.0;
		OASIS_FLOAT sample_mean = 0.0;
		OASIS_FLOAT analytical_mean = 0.0;
		OASIS_FLOAT sd = 0;
		OASIS_FLOAT sumlosssqr = 0.0;
		void (*OutputData)(const summarySampleslevelHeader&, const int,
				   const OASIS_FLOAT, const OASIS_FLOAT, FILE*,
				   const OASIS_FLOAT, const OASIS_FLOAT,
				   const OASIS_FLOAT, const OASIS_FLOAT);
		OutputData = nullptr;
		FILE * outFile = nullptr;
		if (ordOutput) {
			if (skipHeader == false) {
				if (fout[MELT] != nullptr) {
					fprintf(fout[MELT],
						"EventId,SummaryId,SampleType,"
						"EventRate,ChanceOfLoss,"
						"MeanLoss,SDLoss,MaxLoss,"
						"FootprintExposure,"
						"MeanImpactedExposure,"
						"MaxImpactedExposure\n");
				}
				if (fout[QELT] != nullptr) {
					fprintf(fout[QELT], "EventId,SummaryId,Quantile,Loss\n");
				}
			}
			OutputData = &eltcalc::OutputRowsORD;
			outFile = fout[MELT];
		} else if (parquetFileNames.size() == 0) {
			if (skipHeader == false) {
				printf("summary_id,type,event_id,mean,standard_deviation,exposure_value\n");
			}
			OutputData = &eltcalc::OutputRows;
			outFile = stdout;
		}

#ifdef HAVE_PARQUET
		std::map<int, parquet::StreamWriter> os;
		for (auto iter = parquetFileNames.begin();
		  iter != parquetFileNames.end(); ++iter)  {
			os[iter->first] = OasisParquet::GetParquetStreamWriter(iter->first, iter->second);
		}
#endif

		// Losses for calculating quantiles
		std::vector<OASIS_FLOAT> losses_vec;
#ifdef HAVE_PARQUET
		if (fout[QELT] != nullptr || parquetFileNames.find(OasisParquet::QELT) != parquetFileNames.end())
#else
		if (fout[QELT] != nullptr)
#endif
		{
			losses_vec.resize(samplesize, 0);
		}

		summarySampleslevelHeader sh;
		size_t i = fread(&sh, sizeof(sh), 1, stdin);
		while (i != 0) {
			OASIS_FLOAT mean_impacted_exposure = 0;
			OASIS_FLOAT max_impacted_exposure = 0;
			OASIS_FLOAT chance_of_loss = 0;
			int non_zero_samples = 0;
			OASIS_FLOAT max_loss = 0;
			sampleslevelRec sr;
			i = fread(&sr, sizeof(sr), 1, stdin);
			while (i != 0 && sr.sidx != 0) {
				if (sr.sidx > 0) {
					sumloss += sr.loss;
					sumlosssqr += (sr.loss * sr.loss);
#ifdef HAVE_PARQUET
					if (fout[QELT] != nullptr || parquetFileNames.find(OasisParquet::QELT) != parquetFileNames.end())
#else
					if (fout[QELT] != nullptr)
#endif
					{
						losses_vec[sr.sidx-1] = sr.loss;
					}
					if (sr.loss > 0) {
						mean_impacted_exposure += sh.expval;
						if (sh.expval > max_impacted_exposure) {
							max_impacted_exposure = sh.expval;
						}
						non_zero_samples++;
					}
				} else if (sr.sidx == -1) {
					analytical_mean = sr.loss;
				} else if (sr.sidx == max_loss_idx) {
					max_loss = sr.loss;
				}
				i = fread(&sr, sizeof(sr), 1, stdin);
			}
			if (samplesize > 1) {
				sample_mean = sumloss / samplesize;
				sd = (sumlosssqr - ((sumloss*sumloss) / samplesize)) / (samplesize - 1);
				OASIS_FLOAT x = sd / sumlosssqr;
				if (x < 0.0000001) sd = 0;   // fix OASIS_FLOATing point precision problems caused by using large numbers
				sd = sqrt(sd);
				mean_impacted_exposure /= samplesize;
				chance_of_loss = non_zero_samples / (OASIS_FLOAT)samplesize;   // relative frequency
			}
			else {
				if (samplesize == 0) {
					sd = 0;
					sample_mean = 0;
				}
				if (samplesize == 1) {
					sample_mean = sumloss / samplesize;
					sd = 0;
				}
			}
			if (sh.expval > 0) {   // only output rows with a non-zero exposure value
				if (OutputData != nullptr) {
					OutputData(sh, 1, analytical_mean, 0,
						   outFile, sh.expval,
						   sh.expval, 0.0, max_loss);
				}
#ifdef HAVE_PARQUET
				if (parquetFileNames.find(OasisParquet::MELT) != parquetFileNames.end()) {
					OutputRowsParquet(sh, 1,
							  analytical_mean, 0,
							  os[OasisParquet::MELT],
							  sh.expval, sh.expval,
							  0.0, max_loss);
				}
#endif
				if (firstOutput == true) {
					std::this_thread::sleep_for(std::chrono::milliseconds(PIPE_DELAY)); // used to stop possible race condition with kat
					firstOutput = false;
				}
				if (samplesize) {
					if (OutputData != nullptr) {
						OutputData(sh, 2, sample_mean,
							   sd, outFile,
							   mean_impacted_exposure,
							   max_impacted_exposure,
							   chance_of_loss,
							   max_loss);
					}
#ifdef HAVE_PARQUET
					if (parquetFileNames.find(OasisParquet::MELT) != parquetFileNames.end()) {
						OutputRowsParquet(sh, 2,
								  sample_mean,
								  sd,
								  os[OasisParquet::MELT],
								  mean_impacted_exposure,
								  max_impacted_exposure,
								  chance_of_loss,
								  max_loss);
					}
					if (fout[QELT] != nullptr || parquetFileNames.find(OasisParquet::QELT) != parquetFileNames.end())
#else
					if (fout[QELT] != nullptr)
#endif
					{
						std::sort(losses_vec.begin(), losses_vec.end());
#ifdef HAVE_PARQUET
						OutputQuantiles(sh, losses_vec, fout[QELT], os);
#else
						OutputQuantiles(sh, losses_vec, fout[QELT]);
#endif
						std::fill(losses_vec.begin(), losses_vec.end(), 0);
					}
				}
			}


			if (i) i = fread(&sh, sizeof(sh), 1, stdin);

			sumloss = 0.0;
			sumlosssqr = 0.0;
			sd = 0.0;
			analytical_mean = 0.0;
		}

	}
	void doit(bool skipHeader, bool ordOutput, FILE **fout,
		  std::map<int, std::string> &parquetFileNames)
	{
		unsigned int stream_type = 0;
		size_t i = fread(&stream_type, sizeof(stream_type), 1, stdin);

#ifdef HAVE_PARQUET
		if ((ordOutput && fout[MELT] != nullptr) ||
		    parquetFileNames.find(OasisParquet::MELT) != parquetFileNames.end()) {
			GetEventRates();
		}
#else
		if (ordOutput && fout[MELT] != nullptr) GetEventRates();
#endif

		if (isSummaryCalcStream(stream_type) == true) {
			unsigned int samplesize;
			unsigned int summaryset_id;
			i = fread(&samplesize, sizeof(samplesize), 1, stdin);

#ifdef HAVE_PARQUET
			if ((ordOutput && fout[QELT] != nullptr) ||
			    parquetFileNames.find(OasisParquet::QELT) != parquetFileNames.end()) {
				GetIntervals(samplesize);
			}
#else
			if (ordOutput && fout[QELT] != nullptr) GetIntervals(samplesize);
#endif

			if (i == 1) i = fread(&summaryset_id,
					      sizeof(summaryset_id), 1, stdin);
			if (i == 1) {
				doeltoutput(samplesize, skipHeader, ordOutput,
					    fout, parquetFileNames);
			}
			else {
				fprintf(stderr, "FATAL: Stream read error\n");
			}
			return;
		}

		fprintf(stderr, "FATAL: %s: Not a gul stream\n", __func__);
		fprintf(stderr, "FATAL: %s: invalid stream type %d\n", __func__, stream_type);
		exit(-1);
	}


	void touch(const std::string &filepath)
	{
		FILE *fout = fopen(filepath.c_str(), "wb");
		fclose(fout);
	}
	void setinitdone(int processid)
	{
		if (processid) {
			std::ostringstream s;
			s << SEMA_DIR_PREFIX << "_elt/" << processid << ".id";
			touch(s.str());
		}
	}
}